

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.cc
# Opt level: O0

int __thiscall S2EdgeCrosser::CrossingSignInternal2(S2EdgeCrosser *this,S2Point *d)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  double dVar4;
  S2LogMessage local_118;
  S2LogMessageVoidify local_101;
  int local_100;
  byte local_f9;
  int dac;
  S2LogMessageVoidify local_e5;
  int local_e4;
  undefined1 local_e0 [4];
  int cbd;
  Vector3_d c_cross_d;
  S2LogMessage local_c0;
  S2LogMessageVoidify local_ad [20];
  byte local_99;
  S2LogMessage local_98;
  S2LogMessageVoidify local_81;
  Vector3<double> local_80;
  Vector3<double> local_68;
  Vector3_d local_50;
  undefined1 local_38 [8];
  S2Point norm;
  S2Point *d_local;
  S2EdgeCrosser *this_local;
  
  norm.c_[2] = (VType)d;
  if ((this->have_tangents_ & 1U) == 0) {
    S2::RobustCrossProd(&local_50,this->a_,this->b_);
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
              ((D *)local_38,(BasicVector<Vector3,_double,_3UL> *)&local_50);
    Vector3<double>::CrossProd(&local_68,this->a_,(Vector3<double> *)local_38);
    (this->a_tangent_).c_[0] = local_68.c_[0];
    (this->a_tangent_).c_[1] = local_68.c_[1];
    (this->a_tangent_).c_[2] = local_68.c_[2];
    Vector3<double>::CrossProd(&local_80,(Vector3<double> *)local_38,this->b_);
    (this->b_tangent_).c_[0] = local_80.c_[0];
    (this->b_tangent_).c_[1] = local_80.c_[1];
    (this->b_tangent_).c_[2] = local_80.c_[2];
    this->have_tangents_ = true;
  }
  if ((CrossingSignInternal2(Vector3<double>const&)::kError == '\0') &&
     (iVar2 = __cxa_guard_acquire(&CrossingSignInternal2(Vector3<double>const&)::kError), iVar2 != 0
     )) {
    dVar4 = sqrt(3.0);
    CrossingSignInternal2::kError = (1.0 / dVar4 + 1.5) * 2.220446049250313e-16;
    __cxa_guard_release(&CrossingSignInternal2(Vector3<double>const&)::kError);
  }
  dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                    ((BasicVector<Vector3,_double,_3UL> *)this->c_,&this->a_tangent_);
  if (((CrossingSignInternal2::kError < dVar4) &&
      (dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                         ((BasicVector<Vector3,_double,_3UL> *)norm.c_[2],&this->a_tangent_),
      CrossingSignInternal2::kError < dVar4)) ||
     ((dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                         ((BasicVector<Vector3,_double,_3UL> *)this->c_,&this->b_tangent_),
      CrossingSignInternal2::kError < dVar4 &&
      (dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                         ((BasicVector<Vector3,_double,_3UL> *)norm.c_[2],&this->b_tangent_),
      CrossingSignInternal2::kError < dVar4)))) {
    this_local._4_4_ = -1;
  }
  else {
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)this->a_,this->c_);
    if ((((bVar1) ||
         (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                            ((BasicVector<Vector3,_double,_3UL> *)this->a_,(D *)norm.c_[2]), bVar1))
        || (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                              ((BasicVector<Vector3,_double,_3UL> *)this->b_,this->c_), bVar1)) ||
       (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                          ((BasicVector<Vector3,_double,_3UL> *)this->b_,(D *)norm.c_[2]), bVar1)) {
      this_local._4_4_ = 0;
    }
    else {
      bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                        ((BasicVector<Vector3,_double,_3UL> *)this->a_,this->b_);
      if ((bVar1) ||
         (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                            ((BasicVector<Vector3,_double,_3UL> *)this->c_,(D *)norm.c_[2]), bVar1))
      {
        this_local._4_4_ = -1;
      }
      else {
        if (this->acb_ == 0) {
          iVar2 = s2pred::ExpensiveSign(this->a_,this->b_,this->c_,true);
          this->acb_ = -iVar2;
        }
        local_99 = 0;
        if (this->acb_ == 0) {
          S2FatalLogMessage::S2FatalLogMessage
                    ((S2FatalLogMessage *)&local_98,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.cc"
                     ,0x49,kFatal,(ostream *)&std::cerr);
          local_99 = 1;
          poVar3 = S2LogMessage::stream(&local_98);
          poVar3 = std::operator<<(poVar3,"Check failed: (acb_) != (0) ");
          S2LogMessageVoidify::operator&(&local_81,poVar3);
        }
        if ((local_99 & 1) != 0) {
          S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_98);
        }
        if (this->bda_ == 0) {
          iVar2 = s2pred::ExpensiveSign(this->a_,this->b_,(S2Point *)norm.c_[2],true);
          this->bda_ = iVar2;
        }
        c_cross_d.c_[2]._7_1_ = 0;
        if (this->bda_ == 0) {
          S2FatalLogMessage::S2FatalLogMessage
                    ((S2FatalLogMessage *)&local_c0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.cc"
                     ,0x4b,kFatal,(ostream *)&std::cerr);
          c_cross_d.c_[2]._7_1_ = 1;
          poVar3 = S2LogMessage::stream(&local_c0);
          poVar3 = std::operator<<(poVar3,"Check failed: (bda_) != (0) ");
          S2LogMessageVoidify::operator&(local_ad,poVar3);
        }
        if ((c_cross_d.c_[2]._7_1_ & 1) != 0) {
          S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_c0);
        }
        if (this->bda_ == this->acb_) {
          Vector3<double>::CrossProd
                    ((Vector3<double> *)local_e0,this->c_,(Vector3<double> *)norm.c_[2]);
          local_e4 = s2pred::Sign(this->c_,(S2Point *)norm.c_[2],this->b_,(Vector3_d *)local_e0);
          local_e4 = -local_e4;
          local_f9 = 0;
          if (local_e4 == 0) {
            S2FatalLogMessage::S2FatalLogMessage
                      ((S2FatalLogMessage *)&dac,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.cc"
                       ,0x50,kFatal,(ostream *)&std::cerr);
            local_f9 = 1;
            poVar3 = S2LogMessage::stream((S2LogMessage *)&dac);
            poVar3 = std::operator<<(poVar3,"Check failed: (cbd) != (0) ");
            S2LogMessageVoidify::operator&(&local_e5,poVar3);
          }
          if ((local_f9 & 1) != 0) {
            S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&dac);
          }
          if (local_e4 == this->acb_) {
            local_100 = s2pred::Sign(this->c_,(S2Point *)norm.c_[2],this->a_,(Vector3_d *)local_e0);
            if (local_100 == 0) {
              S2FatalLogMessage::S2FatalLogMessage
                        ((S2FatalLogMessage *)&local_118,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.cc"
                         ,0x53,kFatal,(ostream *)&std::cerr);
              poVar3 = S2LogMessage::stream(&local_118);
              poVar3 = std::operator<<(poVar3,"Check failed: (dac) != (0) ");
              S2LogMessageVoidify::operator&(&local_101,poVar3);
              S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_118);
            }
            this_local._4_4_ = 1;
            if (local_100 != this->acb_) {
              this_local._4_4_ = -1;
            }
          }
          else {
            this_local._4_4_ = -1;
          }
        }
        else {
          this_local._4_4_ = -1;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

inline int S2EdgeCrosser::CrossingSignInternal2(const S2Point& d) {
  // At this point, a very common situation is that A,B,C,D are four points on
  // a line such that AB does not overlap CD.  (For example, this happens when
  // a line or curve is sampled finely, or when geometry is constructed by
  // computing the union of S2CellIds.)  Most of the time, we can determine
  // that AB and CD do not intersect by computing the two outward-facing
  // tangents at A and B (parallel to AB) and testing whether AB and CD are on
  // opposite sides of the plane perpendicular to one of these tangents.  This
  // is moderately expensive but still much cheaper than s2pred::ExpensiveSign.
  if (!have_tangents_) {
    S2Point norm = S2::RobustCrossProd(*a_, *b_).Normalize();
    a_tangent_ = a_->CrossProd(norm);
    b_tangent_ = norm.CrossProd(*b_);
    have_tangents_ = true;
  }
  // The error in RobustCrossProd() is insignificant.  The maximum error in
  // the call to CrossProd() (i.e., the maximum norm of the error vector) is
  // (0.5 + 1/sqrt(3)) * DBL_EPSILON.  The maximum error in each call to
  // DotProd() below is DBL_EPSILON.  (There is also a small relative error
  // term that is insignificant because we are comparing the result against a
  // constant that is very close to zero.)
  static const double kError = (1.5 + 1/sqrt(3)) * DBL_EPSILON;
  if ((c_->DotProd(a_tangent_) > kError && d.DotProd(a_tangent_) > kError) ||
      (c_->DotProd(b_tangent_) > kError && d.DotProd(b_tangent_) > kError)) {
    return -1;
  }

  // Otherwise, eliminate the cases where two vertices from different edges
  // are equal.  (These cases could be handled in the code below, but we would
  // rather avoid calling ExpensiveSign whenever possible.)
  if (*a_ == *c_ || *a_ == d || *b_ == *c_ || *b_ == d) return 0;

  // Eliminate cases where an input edge is degenerate.  (Note that in most
  // cases, if CD is degenerate then this method is not even called because
  // acb_ and bda have different signs.)
  if (*a_ == *b_ || *c_ == d) return -1;

  // Otherwise it's time to break out the big guns.
  if (acb_ == 0) acb_ = -s2pred::ExpensiveSign(*a_, *b_, *c_);
  S2_DCHECK_NE(acb_, 0);
  if (bda_ == 0) bda_ = s2pred::ExpensiveSign(*a_, *b_, d);
  S2_DCHECK_NE(bda_, 0);
  if (bda_ != acb_) return -1;

  Vector3_d c_cross_d = c_->CrossProd(d);
  int cbd = -s2pred::Sign(*c_, d, *b_, c_cross_d);
  S2_DCHECK_NE(cbd, 0);
  if (cbd != acb_) return -1;
  int dac = s2pred::Sign(*c_, d, *a_, c_cross_d);
  S2_DCHECK_NE(dac, 0);
  return (dac != acb_) ? -1 : 1;
}